

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

GatherLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gather(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3a2) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3a2;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    GatherLayerParams::GatherLayerParams(this_00.gather_);
    (this->layer_).gather_ = (GatherLayerParams *)this_00;
  }
  return (GatherLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherLayerParams* NeuralNetworkLayer::mutable_gather() {
  if (!has_gather()) {
    clear_layer();
    set_has_gather();
    layer_.gather_ = new ::CoreML::Specification::GatherLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gather)
  return layer_.gather_;
}